

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.hh
# Opt level: O3

string * __thiscall
OB::Color::rgb_to_hex_abi_cxx11_(string *__return_storage_ptr__,Color *this,RGB rgb)

{
  ostream *poVar1;
  ostringstream local_200 [8];
  ostringstream os;
  ios_base local_190 [264];
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::ostringstream::ostringstream(local_200);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"#",1);
  hex_encode_abi_cxx11_(&local_88,this,(char)(int)rgb.r);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_200,local_88._M_dataplus._M_p,local_88._M_string_length);
  hex_encode_abi_cxx11_(&local_68,this,(char)(int)rgb.g);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_68._M_dataplus._M_p,local_68._M_string_length);
  hex_encode_abi_cxx11_(&local_48,this,(char)(int)rgb.b);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_48._M_dataplus._M_p,local_48._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_200);
  std::ios_base::~ios_base(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string rgb_to_hex(RGB rgb) const
  {
    std::ostringstream os; os
    << "#"
    << hex_encode(static_cast<char>(rgb.r))
    << hex_encode(static_cast<char>(rgb.g))
    << hex_encode(static_cast<char>(rgb.b));

    return os.str();
  }